

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall
kratos::PackedStructFieldDef::same(PackedStructFieldDef *this,PackedStructFieldDef *def)

{
  __type_conflict2 _Var1;
  bool local_29;
  PackedStructFieldDef *def_local;
  PackedStructFieldDef *this_local;
  
  if ((this->struct_ == (PackedStruct *)0x0) || (def->struct_ == (PackedStruct *)0x0)) {
    if ((this->struct_ == (PackedStruct *)0x0) && (def->struct_ == (PackedStruct *)0x0)) {
      _Var1 = std::operator==(&this->name,&def->name);
      local_29 = false;
      if ((_Var1) && (local_29 = false, this->width == def->width)) {
        local_29 = (this->signed_ & 1U) == (def->signed_ & 1U);
      }
      this_local._7_1_ = local_29;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = PackedStruct::same(this->struct_,def->struct_);
  }
  return this_local._7_1_;
}

Assistant:

bool PackedStructFieldDef::same(const PackedStructFieldDef &def) const {
    if (struct_ && def.struct_) {
        return struct_->same(*def.struct_);
    } else if (!struct_ && !def.struct_) {
        return name == def.name && width == def.width && signed_ == def.signed_;
    }
    return false;
}